

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void leveldb::log::_Test_UnexpectedFullType::_RunIt(void)

{
  _Test_UnexpectedFullType t;
  LogTest LStack_98;
  
  LogTest::LogTest(&LStack_98);
  _Run((_Test_UnexpectedFullType *)&LStack_98);
  LogTest::~LogTest(&LStack_98);
  return;
}

Assistant:

TEST(LogTest, UnexpectedFullType) {
  Write("foo");
  Write("bar");
  SetByte(6, kFirstType);
  FixChecksum(0, 3);
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("partial record without end"));
}